

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VMPrintf(sqlite3 *db,char *zFormat,__va_list_tag *ap)

{
  char *pcVar1;
  undefined1 local_a0 [8];
  StrAccum acc;
  char zBase [70];
  char *z;
  __va_list_tag *ap_local;
  char *zFormat_local;
  sqlite3 *db_local;
  
  sqlite3StrAccumInit((StrAccum *)local_a0,(char *)&acc.mxAlloc,0x46,db->aLimit[0]);
  local_a0 = (undefined1  [8])db;
  sqlite3VXPrintf((StrAccum *)local_a0,1,zFormat,ap);
  pcVar1 = sqlite3StrAccumFinish((StrAccum *)local_a0);
  if ((char)acc.nAlloc != '\0') {
    db->mallocFailed = '\x01';
  }
  return pcVar1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VMPrintf(sqlite3 *db, const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
  assert( db!=0 );
  sqlite3StrAccumInit(&acc, zBase, sizeof(zBase),
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  acc.db = db;
  sqlite3VXPrintf(&acc, 1, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  if( acc.mallocFailed ){
    db->mallocFailed = 1;
  }
  return z;
}